

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O0

stumpless_entry *
vstumpless_set_entry_message(stumpless_entry *entry,char *message,__va_list_tag *subs)

{
  size_t local_40;
  size_t message_length;
  char *new_message;
  char *old_message;
  __va_list_tag *subs_local;
  char *message_local;
  stumpless_entry *entry_local;
  
  old_message = (char *)subs;
  subs_local = (__va_list_tag *)message;
  message_local = (char *)entry;
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
    entry_local = (stumpless_entry *)0x0;
  }
  else {
    if (message == (char *)0x0) {
      message_length = 0;
      local_40 = 0;
    }
    else {
      message_length = (size_t)no_vsnprintf_s_format_string(message,subs,&local_40);
      if ((char *)message_length == (char *)0x0) {
        return (stumpless_entry *)0x0;
      }
    }
    lock_entry((stumpless_entry *)message_local);
    new_message = *(char **)(message_local + 0x1e0);
    *(size_t *)(message_local + 0x1e0) = message_length;
    *(size_t *)(message_local + 0x1e8) = local_40;
    unlock_entry((stumpless_entry *)message_local);
    free_mem(new_message);
    clear_error();
    entry_local = (stumpless_entry *)message_local;
  }
  return entry_local;
}

Assistant:

struct stumpless_entry *
vstumpless_set_entry_message( struct stumpless_entry *entry,
                              const char *message,
                              va_list subs ) {
  const char *old_message;
  char *new_message;
  size_t message_length;

  VALIDATE_ARG_NOT_NULL( entry );

  if( !message ) {
    new_message = NULL;
    message_length = 0;

  } else {
    new_message = config_format_string( message, subs, &message_length );
    if( !new_message ) {
      return NULL;
    }
  }

  lock_entry( entry );
  old_message = entry->message;
  entry->message = new_message;
  entry->message_length = message_length;
  unlock_entry( entry );

  free_mem( old_message );
  clear_error(  );
  return entry;
}